

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

bool __thiscall ON_SubDHeap::ReturnMeshFragments(ON_SubDHeap *this,ON_SubDFace *face)

{
  ON_SubDMeshFragment *pOVar1;
  bool bVar2;
  ON_SubDMeshFragment *fragment;
  bool bVar3;
  
  if (face == (ON_SubDFace *)0x0) {
    bVar3 = true;
  }
  else {
    ON_SubDComponentBase::Internal_ClearSurfacePointFlag(&face->super_ON_SubDComponentBase);
    fragment = face->m_mesh_fragments;
    face->m_mesh_fragments = (ON_SubDMeshFragment *)0x0;
    do {
      bVar3 = fragment == (ON_SubDMeshFragment *)0x0;
      if (bVar3) {
        return bVar3;
      }
      if (fragment->m_face != face) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      pOVar1 = fragment->m_next_fragment;
      bVar2 = ReturnMeshFragment(this,fragment);
      fragment = pOVar1;
    } while (bVar2);
  }
  return bVar3;
}

Assistant:

bool ON_SubDHeap::ReturnMeshFragments(const ON_SubDFace * face)
{
  if (nullptr != face)
  {
    face->Internal_ClearSurfacePointFlag();
    ON_SubDMeshFragment* fragment = face->m_mesh_fragments;
    face->m_mesh_fragments = nullptr;
    while (nullptr != fragment)
    {
      if (face != fragment->m_face)
        return ON_SUBD_RETURN_ERROR(false);
      ON_SubDMeshFragment* next_fragment = fragment->m_next_fragment;
      if (false == ReturnMeshFragment(fragment))
        return false;
      fragment = next_fragment;
    }
  }
  return true;
}